

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketIO.cpp
# Opt level: O0

void PacketIO::GetInterface(char *name)

{
  int iVar1;
  ifaddrs *piStack_20;
  int family;
  ifaddrs *ifa;
  ifaddrs *ifaddr;
  char *name_local;
  
  ifaddr = (ifaddrs *)name;
  iVar1 = getifaddrs(&ifa);
  if (iVar1 == 0) {
    for (piStack_20 = ifa; piStack_20 != (ifaddrs *)0x0; piStack_20 = piStack_20->ifa_next) {
      if (((piStack_20->ifa_addr != (sockaddr *)0x0) && (piStack_20->ifa_addr->sa_family == 0x11))
         && (iVar1 = strcmp(piStack_20->ifa_name,"lo"), iVar1 != 0)) {
        strcpy((char *)ifaddr,piStack_20->ifa_name);
        break;
      }
    }
    freeifaddrs(ifa);
  }
  return;
}

Assistant:

void PacketIO::GetInterface(char* name)
{
    struct ifaddrs* ifaddr;

    if (getifaddrs(&ifaddr) == 0)
    {
        for (struct ifaddrs* ifa = ifaddr; ifa != nullptr; ifa = ifa->ifa_next)
        {
            if (ifa->ifa_addr == nullptr)
            {
                continue;
            }
            int family = ifa->ifa_addr->sa_family;

            if (family == AF_PACKET)
            {
                if (strcmp(ifa->ifa_name, "lo") != 0)
                {
                    // yes, this is unsafe
                    strcpy(name, ifa->ifa_name);
                    break;
                }
            }

            // /* Display interface name and family (including symbolic
            //     form of the latter for the common families) */

            // printf("%-8s %s (%d)\n",
            //         ifa->ifa_name,
            //         (family == AF_PACKET) ? "AF_PACKET" :
            //         (family == AF_INET) ? "AF_INET" :
            //         (family == AF_INET6) ? "AF_INET6" : "???",
            //         family);
        }
        freeifaddrs(ifaddr);
    }
}